

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O1

vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* __thiscall
gss::innards::HomomorphismSearcher::solution_in_proof_form_abi_cxx11_
          (vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,HomomorphismSearcher *this,HomomorphismAssignments *assignments)

{
  uint uVar1;
  pointer pHVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer pHVar6;
  long lVar7;
  NamedVertex local_80;
  NamedVertex local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHVar6 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar2 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pHVar6 != pHVar2) {
    do {
      ppVar5 = (__return_storage_ptr__->
               super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (__return_storage_ptr__->
               super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar7 = ((long)ppVar3 - (long)ppVar5 >> 4) * -0x3333333333333333 >> 2;
      ppVar4 = ppVar5;
      if (0 < lVar7) {
        uVar1 = (pHVar6->assignment).pattern_vertex;
        ppVar4 = ppVar5 + lVar7 * 4;
        lVar7 = lVar7 + 1;
        ppVar5 = ppVar5 + 2;
        do {
          if (ppVar5[-2].first.first == uVar1) {
            ppVar5 = ppVar5 + -2;
            goto LAB_0013c63a;
          }
          if (ppVar5[-1].first.first == uVar1) {
            ppVar5 = ppVar5 + -1;
            goto LAB_0013c63a;
          }
          if ((ppVar5->first).first == uVar1) goto LAB_0013c63a;
          if (ppVar5[1].first.first == uVar1) {
            ppVar5 = ppVar5 + 1;
            goto LAB_0013c63a;
          }
          lVar7 = lVar7 + -1;
          ppVar5 = ppVar5 + 4;
        } while (1 < lVar7);
      }
      lVar7 = ((long)ppVar3 - (long)ppVar4 >> 4) * -0x3333333333333333;
      if (lVar7 == 1) {
LAB_0013c619:
        ppVar5 = ppVar4;
        if ((ppVar4->first).first != (pHVar6->assignment).pattern_vertex) {
          ppVar5 = ppVar3;
        }
      }
      else if (lVar7 == 2) {
LAB_0013c60e:
        ppVar5 = ppVar4;
        if ((ppVar4->first).first != (pHVar6->assignment).pattern_vertex) {
          ppVar4 = ppVar4 + 1;
          goto LAB_0013c619;
        }
      }
      else {
        ppVar5 = ppVar3;
        if ((lVar7 == 3) &&
           (ppVar5 = ppVar4, (ppVar4->first).first != (pHVar6->assignment).pattern_vertex)) {
          ppVar4 = ppVar4 + 1;
          goto LAB_0013c60e;
        }
      }
LAB_0013c63a:
      if (ppVar3 == ppVar5) {
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                  (&local_80,this->model,(pHVar6->assignment).pattern_vertex);
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                  (&local_58,this->model,(pHVar6->assignment).target_vertex);
        std::
        vector<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>
        ::emplace_back<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>
                  ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>
                    *)__return_storage_ptr__,&local_80,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.second._M_dataplus._M_p != &local_58.second.field_2) {
          operator_delete(local_58.second._M_dataplus._M_p,
                          local_58.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.second._M_dataplus._M_p != &local_80.second.field_2) {
          operator_delete(local_80.second._M_dataplus._M_p,
                          local_80.second.field_2._M_allocated_capacity + 1);
        }
      }
      pHVar6 = pHVar6 + 1;
    } while (pHVar6 != pHVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

auto HomomorphismSearcher::solution_in_proof_form(const HomomorphismAssignments & assignments) const -> vector<pair<NamedVertex, NamedVertex>>
{
    vector<pair<NamedVertex, NamedVertex>> solution;
    for (auto & a : assignments.values)
        if (solution.end() == find_if(solution.begin(), solution.end(), [&](const auto & t) { return unsigned(t.first.first) == a.assignment.pattern_vertex; }))
            solution.emplace_back(
                model.pattern_vertex_for_proof(a.assignment.pattern_vertex),
                model.target_vertex_for_proof(a.assignment.target_vertex));
    return solution;
}